

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

Unary * __thiscall wasm::Builder::makeUnary(Builder *this,UnaryOp op,Expression *value)

{
  Unary *pUVar1;
  
  pUVar1 = MixedArena::alloc<wasm::Unary>(&this->wasm->allocator);
  pUVar1->op = op;
  pUVar1->value = value;
  ::wasm::Unary::finalize();
  return pUVar1;
}

Assistant:

Unary* makeUnary(UnaryOp op, Expression* value) {
    auto* ret = wasm.allocator.alloc<Unary>();
    ret->op = op;
    ret->value = value;
    ret->finalize();
    return ret;
  }